

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

Fad<long_double> * __thiscall
TPZMatrix<Fad<long_double>_>::ConditionNumber
          (Fad<long_double> *__return_storage_ptr__,TPZMatrix<Fad<long_double>_> *this,int p,
          int64_t numiter,REAL tol)

{
  uint uVar1;
  int iVar2;
  longdouble *plVar3;
  long lVar4;
  longdouble *plVar5;
  longdouble *plVar6;
  int sz;
  ulong uVar7;
  Fad<long_double> invnorm;
  Fad<long_double> thisnorm;
  Fad<long_double> local_128;
  Fad<long_double> local_f8;
  TPZFMatrix<Fad<long_double>_> local_c0;
  
  local_c0.super_TPZMatrix<Fad<long_double>_>.super_TPZBaseMatrix.fRow = 0;
  local_c0.super_TPZMatrix<Fad<long_double>_>.super_TPZBaseMatrix.fCol = 0;
  local_c0.super_TPZMatrix<Fad<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<Fad<long_double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<Fad<long_double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)&PTR__TPZFMatrix_01846990;
  local_c0.fElem = (Fad<long_double> *)0x0;
  local_c0.fGiven = (Fad<long_double> *)0x0;
  local_c0.fSize = 0;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01846c80;
  local_c0.fWork.fStore = (Fad<long_double> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  MatrixNorm(&local_f8,this,p,numiter,tol);
  iVar2 = Inverse(this,&local_c0,ENoDecompose);
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TVar TPZMatrix<Fad<long double>>::ConditionNumber(int, int64_t, REAL) [T = Fad<long double>]"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," - it was not possible to compute the inverse matrix.",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    __return_storage_ptr__->val_ = (longdouble)0;
    (__return_storage_ptr__->dx_).num_elts = 0;
    (__return_storage_ptr__->dx_).ptr_to_data = (longdouble *)0x0;
    *(undefined8 *)&__return_storage_ptr__->defaultVal = 0;
    *(undefined2 *)((long)&__return_storage_ptr__->defaultVal + 8) = 0;
  }
  else {
    MatrixNorm(&local_128,&local_c0.super_TPZMatrix<Fad<long_double>_>,p,numiter,tol);
    uVar1 = local_128.dx_.num_elts;
    if (local_128.dx_.num_elts < local_f8.dx_.num_elts) {
      uVar1 = local_f8.dx_.num_elts;
    }
    __return_storage_ptr__->val_ = local_128.val_ * local_f8.val_;
    (__return_storage_ptr__->dx_).num_elts = 0;
    (__return_storage_ptr__->dx_).ptr_to_data = (longdouble *)0x0;
    if ((int)uVar1 < 1) {
      __return_storage_ptr__->defaultVal = (longdouble)0;
    }
    else {
      (__return_storage_ptr__->dx_).num_elts = uVar1;
      uVar7 = (ulong)uVar1;
      plVar3 = (longdouble *)operator_new__(uVar7 << 4);
      (__return_storage_ptr__->dx_).ptr_to_data = plVar3;
      __return_storage_ptr__->defaultVal = (longdouble)0;
      if (0 < (int)uVar1) {
        plVar3 = (__return_storage_ptr__->dx_).ptr_to_data;
        lVar4 = 0;
        do {
          plVar5 = (longdouble *)((long)local_f8.dx_.ptr_to_data + lVar4);
          if (local_f8.dx_.num_elts == 0) {
            plVar5 = &local_f8.defaultVal;
          }
          plVar6 = (longdouble *)((long)local_128.dx_.ptr_to_data + lVar4);
          if (local_128.dx_.num_elts == 0) {
            plVar6 = &local_128.defaultVal;
          }
          *(longdouble *)((long)plVar3 + lVar4) = local_f8.val_ * *plVar6 + local_128.val_ * *plVar5
          ;
          lVar4 = lVar4 + 0x10;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
    }
    Fad<long_double>::~Fad(&local_128);
  }
  Fad<long_double>::~Fad(&local_f8);
  TPZFMatrix<Fad<long_double>_>::~TPZFMatrix(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}